

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this)

{
  int iVar1;
  json_parser_exception *this_00;
  size_t byte_index;
  lexer *in_RSI;
  int c;
  undefined1 local_70 [8];
  lexer l;
  parser *this_local;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *res;
  
  reader::reset_byte_index((reader *)in_RSI->_vptr_lexer);
  lexer::lexer((lexer *)local_70,(reader *)in_RSI->_vptr_lexer,*(size_t *)&in_RSI->m_last_put_back);
  parse_value(this,in_RSI,(size_t)local_70);
  if (((ulong)in_RSI->m_reader & 1) != 0) {
    while (iVar1 = (**(code **)(*in_RSI->_vptr_lexer + 0x10))(), iVar1 != -1) {
      if ((((iVar1 != 0x20) && (iVar1 != 9)) && (iVar1 != 10)) && (iVar1 != 0xd)) {
        this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
        byte_index = reader::get_byte_index((reader *)in_RSI->_vptr_lexer);
        json_parser_exception::json_parser_exception(this_00,invalid_character_e,byte_index);
        __cxa_throw(this_00,&json_parser_exception::typeinfo,
                    json_parser_exception::~json_parser_exception);
      }
    }
  }
  lexer::~lexer((lexer *)local_70);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse()
{
    m_reader.reset_byte_index();

    lexer l(m_reader, m_max_token_length);

    auto res = parse_value(l, 0);

    if (m_read_all)
    {
        // check that there isn't anything other than whitespace left
        int c;

        while ((c = m_reader.next()) != EOF)
        {
            if ((c != 0x20) && (c != 0x09) && (c != 0x0A) && (c != 0x0D))
            {
                throw json_parser_exception(json_parser_exception::invalid_character_e, m_reader.get_byte_index());
            }
        }
    }
    return res;
}